

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thybrd1_.c
# Opt level: O2

void fcn(int *n,double *x,double *fvec,int *iflag)

{
  double dVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  
  if (*iflag != 0) {
    uVar2 = *n;
    uVar3 = 0;
    uVar4 = 0;
    if (0 < (int)uVar2) {
      uVar4 = (ulong)uVar2;
    }
    for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      dVar5 = 0.0;
      dVar6 = 0.0;
      if (uVar3 != 0) {
        dVar6 = x[uVar3 - 1];
      }
      if ((ulong)uVar2 - 1 != uVar3) {
        dVar5 = x[uVar3 + 1];
      }
      dVar1 = x[uVar3];
      fvec[uVar3] = (((3.0 - (dVar1 + dVar1)) * dVar1 - dVar6) - (dVar5 + dVar5)) + 1.0;
    }
  }
  return;
}

Assistant:

void fcn(const int *n, const real *x, real *fvec, int *iflag)
{
/*      subroutine fcn for hybrd1 example. */

  int k;
  real temp, temp1, temp2;
  assert(*n == 9);

  if (*iflag == 0) {
    /*      insert print statements here when nprint is positive. */
    /* if the nprint parameter to lmder is positive, the function is
       called every nprint iterations with iflag=0, so that the
       function may perform special operations, such as printing
       residuals. */
    return;
  }

  /* compute residuals */
  for (k=1; k <= *n; k++) {
    temp = (3 - 2*x[k-1])*x[k-1];
    temp1 = 0;
    if (k != 1) {
      temp1 = x[k-1-1];
    }
    temp2 = 0;
    if (k != *n) {
      temp2 = x[k+1-1];
    }
    fvec[k-1] = temp - temp1 - 2*temp2 + 1;
  }
  return;
}